

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderPropertiesDefaultContextWideValues::iterate
          (TessellationShaderPropertiesDefaultContextWideValues *this)

{
  ostringstream *poVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *this_01;
  int *piVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  GLboolean bool_value [4];
  GLfloat float_value [4];
  GLint expected_int_value [4];
  GLint int_value [4];
  GLint property_value_data [9];
  undefined4 local_244;
  TessellationShaderPropertiesDefaultContextWideValues *local_240;
  ulong local_238;
  uint local_230;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long local_1f8;
  int *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  TestLog local_1c8 [13];
  ios_base local_160 [264];
  GLenum local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1d8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1f8 = CONCAT44(extraout_var,iVar5);
  local_58 = (this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES;
  piVar8 = (int *)((long)&local_54 + 4);
  local_54 = 0x300000001;
  uStack_4c = 0x400008e74;
  local_44 = 1;
  uStack_40 = 0x8e73;
  uStack_3c = 2;
  uStack_38 = 1;
  local_240 = this;
  local_230 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  local_210 = 0;
  do {
    lVar4 = local_1f8;
    local_244 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    uVar2 = piVar8[-2];
    uVar9 = (ulong)uVar2;
    iVar5 = *piVar8;
    iVar3 = piVar8[-1];
    local_1f0 = piVar8;
    (**(code **)(local_1f8 + 0x798))(uVar9,&local_244);
    dVar6 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar6,"glGetBooleanv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x58);
    (**(code **)(lVar4 + 0x818))(uVar2,&local_228);
    dVar6 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar6,"glGetFloatv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5b);
    local_238 = uVar9;
    (**(code **)(lVar4 + 0x868))(uVar9,&local_1e8);
    dVar6 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5e);
    local_22c = (uint)(iVar5 != 0) * 0x1010101;
    local_208 = iVar5;
    local_204 = iVar5;
    local_200 = iVar5;
    local_1fc = iVar5;
    iVar7 = bcmp(&local_22c,&local_244,(long)iVar3);
    if (iVar7 != 0) {
      local_1d8._0_8_ =
           ((local_240->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetBooleanv() called for pname ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," reported invalid value.",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_160);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value reported by glGetBooleanv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x6e);
      goto LAB_00d3dbcb;
    }
    iVar7 = bcmp(&local_208,&local_1e8,(long)iVar3 * 4);
    if (iVar7 != 0) {
      local_1d8._0_8_ =
           ((local_240->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetIntegerv() called for pname ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," reported invalid value.",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_160);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value reported by glGetIntegerv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x76);
      goto LAB_00d3dbcb;
    }
    fVar11 = (float)iVar5;
    if (0 < iVar3) {
      fVar13 = (float)local_228 - fVar11;
      fVar12 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar12 = fVar13;
      }
      if (fVar12 <= 1e-05) goto LAB_00d3d90c;
LAB_00d3d9c0:
      local_1d8._0_8_ =
           ((local_240->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetFloatv() called for pname ",0x1f);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," reported invalid value.",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_160);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value reported by glGetFloatv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x81);
LAB_00d3dbcb:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
LAB_00d3d90c:
    if (1 < iVar3) {
      fVar13 = local_228._4_4_ - fVar11;
      fVar12 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar12 = fVar13;
      }
      if (1e-05 < fVar12) goto LAB_00d3d9c0;
    }
    if (2 < iVar3) {
      fVar13 = (float)uStack_220 - fVar11;
      fVar12 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar12 = fVar13;
      }
      if (1e-05 < fVar12) goto LAB_00d3d9c0;
    }
    if (3 < iVar3) {
      fVar11 = uStack_220._4_4_ - fVar11;
      fVar12 = -fVar11;
      if (-fVar11 <= fVar11) {
        fVar12 = fVar11;
      }
      if (1e-05 < fVar12) goto LAB_00d3d9c0;
    }
    if ((local_230 & 0x300) == 0) break;
    uVar9 = local_210 + 1;
    piVar8 = local_1f0 + 3;
    bVar10 = local_210 < 2;
    local_210 = uVar9;
  } while (bVar10);
  tcu::TestContext::setTestResult
            ((local_240->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesDefaultContextWideValues::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Iterate through all context-wide properties and compare expected values
	 * against the reference ones
	 */
	const float			  epsilon = (float)1e-5;
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();

	const glw::GLint property_value_data[] = { /* pname */ /* n components */ /* default value */
											   static_cast<glw::GLint>(m_glExtTokens.PATCH_VERTICES), 1, 3,
											   /* The following values are only applicable to Desktop OpenGL. */
											   GL_PATCH_DEFAULT_OUTER_LEVEL, 4, 1, GL_PATCH_DEFAULT_INNER_LEVEL, 2, 1 };

	const unsigned int n_properties = (glu::isContextTypeES(m_context.getRenderContext().getType())) ? 1 : 3;

	for (unsigned int n_property = 0; n_property < n_properties; ++n_property)
	{
		glw::GLboolean bool_value[4]  = { GL_FALSE };
		glw::GLfloat   float_value[4] = { 0.0f };
		glw::GLint	 int_value[4]   = { 0 };

		glw::GLenum pname		   = property_value_data[n_property * 3 + 0];
		glw::GLint  n_components   = property_value_data[n_property * 3 + 1];
		glw::GLint  expected_value = property_value_data[n_property * 3 + 2];

		/* Call all relevant getters */
		gl.getBooleanv(pname, bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() failed.");

		gl.getFloatv(pname, float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() failed.");

		gl.getIntegerv(pname, int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed.");

		/* Compare retrieved vector value components against expected value */
		glw::GLboolean expected_bool_value[4] = {
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE
		};
		glw::GLint expected_int_value[4] = { expected_value, expected_value, expected_value, expected_value };

		if (memcmp(expected_bool_value, bool_value, sizeof(bool) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetBooleanv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetBooleanv()");
		}

		if (memcmp(expected_int_value, int_value, sizeof(int) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetIntegerv()");
		}

		if ((n_components >= 1 && de::abs(float_value[0] - (float)expected_value) > epsilon) ||
			(n_components >= 2 && de::abs(float_value[1] - (float)expected_value) > epsilon) ||
			(n_components >= 3 && de::abs(float_value[2] - (float)expected_value) > epsilon) ||
			(n_components >= 4 && de::abs(float_value[3] - (float)expected_value) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetFloatv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetFloatv()");
		}
	} /* for (all properties) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}